

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Flate.cc
# Opt level: O1

bool Pl_Flate::zopfli_enabled(void)

{
  return false;
}

Assistant:

bool
Pl_Flate::zopfli_enabled()
{
    if (zopfli_supported()) {
        std::string value;
        static bool enabled = QUtil::get_env("QPDF_ZOPFLI", &value) && value != "disabled";
        return enabled;
    } else {
        return false;
    }
}